

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

InplaceStr GetTypeDefaultConstructorName(ExpressionContext *ctx,TypeClass *classType)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  char *name;
  undefined1 auStack_38 [4];
  uint length;
  InplaceStr baseName;
  TypeClass *classType_local;
  ExpressionContext *ctx_local;
  
  baseName.end = (char *)classType;
  _auStack_38 = GetTypeConstructorName(classType);
  uVar1 = InplaceStr::length((InplaceStr *)auStack_38);
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(uVar1 + 2));
  NULLC::SafeSprintf((char *)CONCAT44(extraout_var,iVar2),(ulong)(uVar1 + 2),"%.*s$",
                     (ulong)(uint)((int)baseName.begin - auStack_38));
  InplaceStr::InplaceStr((InplaceStr *)&ctx_local,(char *)CONCAT44(extraout_var,iVar2));
  return _ctx_local;
}

Assistant:

InplaceStr GetTypeDefaultConstructorName(ExpressionContext &ctx, TypeClass *classType)
{
	InplaceStr baseName(GetTypeConstructorName(classType));

	unsigned length = baseName.length() + 2;
	char *name = (char*)ctx.allocator->alloc(length);
	NULLC::SafeSprintf(name, length, "%.*s$", FMT_ISTR(baseName));

	return InplaceStr(name);
}